

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O0

void mi_thread_init(void)

{
  _Bool _Var1;
  size_t in_stack_ffffffffffffffe8;
  mi_stat_count_t *in_stack_fffffffffffffff0;
  
  mi_process_init();
  _Var1 = _mi_thread_heap_init();
  if (!_Var1) {
    _mi_stat_increase(in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8);
    LOCK();
    thread_count = thread_count + 1;
    UNLOCK();
  }
  return;
}

Assistant:

void mi_thread_init(void) mi_attr_noexcept
{
  // ensure our process has started already
  mi_process_init();

  // initialize the thread local default heap
  // (this will call `_mi_heap_set_default_direct` and thus set the
  //  fiber/pthread key to a non-zero value, ensuring `_mi_thread_done` is called)
  if (_mi_thread_heap_init()) return;  // returns true if already initialized

  _mi_stat_increase(&_mi_stats_main.threads, 1);
  mi_atomic_increment_relaxed(&thread_count);
  //_mi_verbose_message("thread init: 0x%zx\n", _mi_thread_id());
}